

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O0

void __thiscall
icu_63::ContractionsAndExpansions::addStrings
          (ContractionsAndExpansions *this,UChar32 start,UChar32 end,UnicodeSet *set)

{
  uint uVar1;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  undefined1 local_60 [8];
  UnicodeString s;
  UnicodeSet *set_local;
  UChar32 end_local;
  UChar32 start_local;
  ContractionsAndExpansions *this_local;
  
  if (set != (UnicodeSet *)0x0) {
    s.fUnion._48_8_ = set;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_60,&this->unreversedPrefix);
    set_local._4_4_ = start;
    do {
      icu_63::UnicodeString::append((UnicodeString *)local_60,set_local._4_4_);
      if (this->suffix != (UnicodeString *)0x0) {
        icu_63::UnicodeString::append((UnicodeString *)local_60,this->suffix);
      }
      UnicodeSet::add((UnicodeSet *)s.fUnion._48_8_,(UnicodeString *)local_60);
      uVar1 = icu_63::UnicodeString::length(&this->unreversedPrefix);
      icu_63::UnicodeString::truncate
                ((UnicodeString *)local_60,(char *)(ulong)uVar1,CONCAT44(extraout_var,extraout_EDX))
      ;
      set_local._4_4_ = set_local._4_4_ + 1;
    } while (set_local._4_4_ <= end);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_60);
  }
  return;
}

Assistant:

void
ContractionsAndExpansions::addStrings(UChar32 start, UChar32 end, UnicodeSet *set) {
    if(set == NULL) { return; }
    UnicodeString s(unreversedPrefix);
    do {
        s.append(start);
        if(suffix != NULL) {
            s.append(*suffix);
        }
        set->add(s);
        s.truncate(unreversedPrefix.length());
    } while(++start <= end);
}